

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O1

int coda_type_number_set_conversion(coda_type_number *type,coda_conversion *conversion)

{
  if (type == (coda_type_number *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x714);
  }
  else {
    if (type->conversion == (coda_conversion *)0x0) {
      type->conversion = conversion;
      return 0;
    }
    coda_set_error(-400,"type already has a conversion");
  }
  return -1;
}

Assistant:

int coda_type_number_set_conversion(coda_type_number *type, coda_conversion *conversion)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->conversion != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "type already has a conversion");
        return -1;
    }
    type->conversion = conversion;
    return 0;
}